

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld
          (DescriptorPool *this,string_view name,FlatAllocator *alloc)

{
  FileDescriptor *__s;
  string *psVar1;
  FileOptions *pFVar2;
  FeatureSet *pFVar3;
  FileDescriptorTables *pFVar4;
  SourceCodeInfo *pSVar5;
  FileDescriptor *placeholder;
  FlatAllocator *alloc_local;
  DescriptorPool *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  if (this->mutex_ != (Mutex *)0x0) {
    absl::lts_20250127::Mutex::AssertHeld(this->mutex_);
  }
  __s = anon_unknown_24::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::AllocateArray<google::protobuf::FileDescriptor>
                  (&alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ,1);
  memset(__s,0,0xa8);
  psVar1 = protobuf::(anonymous_namespace)::
           FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           ::AllocateStrings<std::basic_string_view<char,std::char_traits<char>>const&>
                     ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                       *)alloc,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __s->name_ = psVar1;
  psVar1 = internal::GetEmptyString_abi_cxx11_();
  __s->package_ = psVar1;
  __s->pool_ = this;
  pFVar2 = FileOptions::default_instance();
  __s->options_ = pFVar2;
  pFVar3 = FeatureSet::default_instance();
  __s->proto_features_ = pFVar3;
  pFVar3 = FeatureSet::default_instance();
  __s->merged_features_ = pFVar3;
  pFVar4 = FileDescriptorTables::GetEmptyInstance();
  __s->tables_ = pFVar4;
  pSVar5 = SourceCodeInfo::default_instance();
  __s->source_code_info_ = pSVar5;
  __s->is_placeholder_ = true;
  __s->finished_building_ = true;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    const absl::string_view name, internal::FlatAllocator& alloc) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = alloc.AllocateArray<FileDescriptor>(1);
  memset(static_cast<void*>(placeholder), 0, sizeof(*placeholder));

  placeholder->name_ = alloc.AllocateStrings(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->proto_features_ = &FeatureSet::default_instance();
  placeholder->merged_features_ = &FeatureSet::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->finished_building_ = true;
  // All other fields are zero or nullptr.

  return placeholder;
}